

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  undefined4 *puVar5;
  BigNumber *pBVar6;
  int r;
  byte bVar7;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  BigNumber encrypt;
  BigNumber resultat;
  BigNumber n;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_350;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_338;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_320;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_308;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2f0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> real_r21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> d1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> e1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> q1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> p1;
  BigNumber m;
  BigNumber v;
  BigNumber local_1d8;
  BigNumber local_1b8;
  BigNumber local_198;
  BigNumber local_178;
  BigNumber local_158;
  BigNumber decrypt;
  BigNumber q;
  BigNumber p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inv_r;
  vector<unsigned_int,_std::allocator<unsigned_int>_> n1;
  BigNumber real_r2;
  
  bVar7 = 0;
  lVar4 = 0x11;
  puVar5 = &DAT_00105004;
  pBVar6 = &real_r2;
  for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + 1;
    pBVar6 = (BigNumber *)
             ((long)&(pBVar6->super_Polynome).m_coef.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + 4);
  }
  __l._M_len = 0x11;
  __l._M_array = (iterator)&real_r2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&p1,__l,(allocator_type *)&encrypt);
  puVar5 = &DAT_00105048;
  pBVar6 = &real_r2;
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + (ulong)bVar7 * -8 + 4);
  }
  __l_00._M_len = 0x11;
  __l_00._M_array = (iterator)&real_r2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&q1,__l_00,(allocator_type *)&encrypt);
  puVar5 = &DAT_0010508c;
  pBVar6 = &real_r2;
  for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + (ulong)bVar7 * -8 + 4);
  }
  __l_01._M_len = 0x11;
  __l_01._M_array = (iterator)&real_r2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&e1,__l_01,(allocator_type *)&encrypt);
  memcpy(&real_r2,&DAT_001050d0,0x84);
  __l_02._M_len = 0x21;
  __l_02._M_array = (iterator)&real_r2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&n1,__l_02,(allocator_type *)&encrypt);
  memcpy(&real_r2,&DAT_00105154,0x84);
  __l_03._M_len = 0x21;
  __l_03._M_array = (iterator)&real_r2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&v1,__l_03,(allocator_type *)&encrypt);
  puVar5 = &DAT_001051d8;
  pBVar6 = &real_r2;
  for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + (ulong)bVar7 * -8 + 4);
  }
  __l_04._M_len = 0x20;
  __l_04._M_array = (iterator)&real_r2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&d1,__l_04,(allocator_type *)&encrypt);
  puVar5 = &DAT_00105258;
  pBVar6 = &real_r2;
  for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + (ulong)bVar7 * -8 + 4);
  }
  __l_05._M_len = 0x20;
  __l_05._M_array = (iterator)&real_r2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&real_r21,__l_05,(allocator_type *)&encrypt);
  puVar5 = &DAT_001052d8;
  pBVar6 = &real_r2;
  for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + (ulong)bVar7 * -8 + 4);
  }
  __l_06._M_len = 0x20;
  __l_06._M_array = (iterator)&real_r2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&inv_r,__l_06,(allocator_type *)&encrypt);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2c0,&e1);
  BigNumber::BigNumber
            (&encrypt,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2c0,0x100000000,
             1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2c0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2d8,&p1);
  BigNumber::BigNumber
            (&p,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2d8,0x100000000,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2f0,&q1);
  BigNumber::BigNumber
            (&q,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2f0,0x100000000,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2f0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_308,&d1);
  BigNumber::BigNumber
            (&decrypt,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_308,0x100000000,
             1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_308);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_320,&v1);
  BigNumber::BigNumber
            (&v,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_320,0x100000000,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_320);
  puVar5 = &DAT_00105358;
  pBVar6 = &real_r2;
  for (lVar4 = 0x1e; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)
     &(pBVar6->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    pBVar6 = (BigNumber *)((long)pBVar6 + (ulong)bVar7 * -8 + 4);
  }
  __l_07._M_len = 0x1e;
  __l_07._M_array = (iterator)&real_r2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_338,__l_07,
             (allocator_type *)&n);
  BigNumber::BigNumber
            (&m,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_338,0x100000000,1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_338);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_350,&real_r21);
  BigNumber::BigNumber
            (&real_r2,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_350,0x100000000,
             1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_350);
  BigNumber::BigNumber(&local_158,&p);
  BigNumber::BigNumber(&local_178,&q);
  operator*(&n,&local_158,&local_178);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_178);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_158);
  clock();
  r = (int)((ulong)((long)n.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)n.super_Polynome.m_coef.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
  BigNumber::m_square_and_multiply(&resultat,&m,&encrypt,&n,r,&v,&real_r2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Cipher : ");
  BigNumber::BigNumber(&local_198,&resultat);
  poVar2 = operator<<(poVar2,&local_198);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198);
  BigNumber::m_square_and_multiply(&local_1b8,&resultat,&decrypt,&n,r,&v,&real_r2);
  BigNumber::operator=(&resultat,&local_1b8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b8);
  poVar2 = std::operator<<((ostream *)&std::cout,"Plaintext : ");
  BigNumber::BigNumber(&local_1d8,&resultat);
  poVar2 = operator<<(poVar2,&local_1d8);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1d8);
  clock();
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1a67);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2,anon_var_dwarf_1a7d);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Comparaison : ");
  bVar1 = operator==(&resultat,&m);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)bVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&resultat);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&n);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&real_r2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&m);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&v);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&decrypt);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&q);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&encrypt);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&inv_r.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&real_r21.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&d1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&v1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&n1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&e1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&q1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&p1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return 0;
}

Assistant:

int main() {
    clock_t t1, t2;
    long unsigned int base = 4294967296;

    vector <unsigned int> p1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 75};
    vector <unsigned int> q1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 145};
    vector <unsigned int> e1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 285};
    vector <unsigned int> n1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 220, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 10875};
    vector <unsigned int> v1 = {1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627, 3554194397, 2672956310, 1462788076, 386586051, 1045080972, 584698610, 415168777, 3068734737, 3564255822, 1704807014, 3640413780, 3181632784, 4176880379, 343992323, 865312491, 2334487511, 1789470971, 3377127848, 432853715, 2287094768, 3608167468, 693513799, 3021682278, 3335659198, 1487342237, 3697028860, 2115296077};
    vector <unsigned int> d1 = {2366988799, 3777567450, 4256133434, 3715635382, 2102803053, 538910050, 2658892395, 2033075339, 2739880485, 223619520, 286417771, 1478718362, 3618622911, 2363957160, 698720772, 3590039000, 325540360, 306051247, 2601868696, 160532541, 846116208, 2547732272, 2242835935, 1222905716, 1111601229, 2197361339, 2284845799, 4005084793, 2365400798, 528660221, 430348475, 4280536789};
    vector <unsigned int> real_r21 = {4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4289104296, 0, 219, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 3886882921, 0, 10875};
    vector <unsigned int> inv_r = {1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627, 3554194397, 2672956310, 1462788076, 386586051, 1045080972, 584698610, 415168777, 3068734737, 3564255822, 1704807081, 955936537, 3573085035, 3713111524, 568534961, 675263962, 789347009, 2028190576, 3016996571, 123683255, 1436680122, 1597747354, 478189140, 4164500159, 4147436048, 3939575293, 797453360};

    BigNumber encrypt (e1, base, 1);
    BigNumber p (p1, base, 1);
    BigNumber q (q1, base, 1);
    BigNumber decrypt (d1, base, 1);
    BigNumber v (v1, base, 1);
    BigNumber m({1,2,3,4, 1462085356, 489085113, 3474155137, 363905627, 567934108, 1462085356, 489085113, 3474155137, 363905627,1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627,1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627, 3554194397, 2672956310, 1462788076,1212, 86537}, base, 1);
    BigNumber real_r2 (real_r21, base, 1);
    BigNumber n = p*q;
    int r = (int) n.m_degre();
    t1 = clock();
    BigNumber resultat = m.m_square_and_multiply(encrypt, n, r, v, real_r2);
    cout << "Cipher : " << resultat << endl;
    resultat = resultat.m_square_and_multiply(decrypt, n, r, v, real_r2);
    cout << "Plaintext : " << resultat << endl;
    t2 = clock();
    cout << "Chiffré et déchiffré en " << (t2 - t1) << " unités" << endl;
    cout << "Comparaison : " << (int)(resultat == m) <<endl;


    return 0;
}